

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFunctionalTests.cpp
# Opt level: O2

int __thiscall deqp::gles31::Functional::ShaderTests::init(ShaderTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  ShaderLibraryGroup *pSVar2;
  
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderBuiltinVarTests::ShaderBuiltinVarTests
            ((ShaderBuiltinVarTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderBuiltinFunctionTests::ShaderBuiltinFunctionTests
            ((ShaderBuiltinFunctionTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  SampleVariableTests::SampleVariableTests
            ((SampleVariableTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderMultisampleInterpolationTests::ShaderMultisampleInterpolationTests
            ((ShaderMultisampleInterpolationTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  OpaqueTypeIndexingTests::OpaqueTypeIndexingTests
            ((OpaqueTypeIndexingTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pSVar2 = (ShaderLibraryGroup *)operator_new(0x88);
  ShaderLibraryGroup::ShaderLibraryGroup
            (pSVar2,(this->super_TestCaseGroup).m_context,"functions","Function Tests",2,
             init::s_functionFiles);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  pSVar2 = (ShaderLibraryGroup *)operator_new(0x88);
  ShaderLibraryGroup::ShaderLibraryGroup
            (pSVar2,(this->super_TestCaseGroup).m_context,"arrays","Array Tests",2,
             init::s_arraysFiles);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  pSVar2 = (ShaderLibraryGroup *)operator_new(0x88);
  ShaderLibraryGroup::ShaderLibraryGroup
            (pSVar2,(this->super_TestCaseGroup).m_context,"arrays_of_arrays","Arrays of Arras Tests"
             ,2,init::s_arraysOfArraysFiles);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderLinkageTests::ShaderLinkageTests
            ((ShaderLinkageTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderBuiltinConstantTests::ShaderBuiltinConstantTests
            ((ShaderBuiltinConstantTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderHelperInvocationTests::ShaderHelperInvocationTests
            ((ShaderHelperInvocationTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pSVar2 = (ShaderLibraryGroup *)operator_new(0x88);
  ShaderLibraryGroup::ShaderLibraryGroup
            (pSVar2,(this->super_TestCaseGroup).m_context,"implicit_conversions",
             "GL_EXT_shader_implicit_conversions Tests",2,init::s_implicitConversionsFiles);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  pSVar2 = (ShaderLibraryGroup *)operator_new(0x88);
  ShaderLibraryGroup::ShaderLibraryGroup
            (pSVar2,(this->super_TestCaseGroup).m_context,"uniform_block","Uniform block tests",2,
             init::s_uniformBlockFiles);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  return extraout_EAX;
}

Assistant:

void init (void)
	{
		addChild(new ShaderBuiltinVarTests				(m_context));
		addChild(new ShaderBuiltinFunctionTests			(m_context));
		addChild(new SampleVariableTests				(m_context));
		addChild(new ShaderMultisampleInterpolationTests(m_context));
		addChild(new OpaqueTypeIndexingTests			(m_context));

		{
			static const ShaderLibraryGroup::File s_functionFiles[] =
			{
				{ "shaders/es31/functions.test",	"es31",		"GLSL ES 3.1 Function Tests"	},
				{ "shaders/es32/functions.test",	"es32",		"GLSL ES 3.2 Function Tests"	},
			};
			addChild(new ShaderLibraryGroup(m_context, "functions", "Function Tests", DE_LENGTH_OF_ARRAY(s_functionFiles), s_functionFiles));
		}

		{
			static const ShaderLibraryGroup::File s_arraysFiles[] =
			{
				{ "shaders/es31/arrays.test",	"es31",		"GLSL ES 3.1 Array Tests"	},
				{ "shaders/es32/arrays.test",	"es32",		"GLSL ES 3.2 Array Tests"	},
			};
			addChild(new ShaderLibraryGroup(m_context, "arrays", "Array Tests", DE_LENGTH_OF_ARRAY(s_arraysFiles), s_arraysFiles));
		}

		{
			static const ShaderLibraryGroup::File s_arraysOfArraysFiles[] =
			{
				{ "shaders/es31/arrays_of_arrays.test",		"es31",		"GLSL ES 3.1 Arrays of Arrays Tests"	},
				{ "shaders/es32/arrays_of_arrays.test",		"es32",		"GLSL ES 3.2 Arrays of Arrays Tests"	},
			};
			addChild(new ShaderLibraryGroup(m_context, "arrays_of_arrays", "Arrays of Arras Tests", DE_LENGTH_OF_ARRAY(s_arraysOfArraysFiles), s_arraysOfArraysFiles));
		}

		addChild(new ShaderLinkageTests					(m_context));
		addChild(new ShaderBuiltinConstantTests			(m_context));
		addChild(new ShaderHelperInvocationTests		(m_context));

		{
			static const ShaderLibraryGroup::File s_implicitConversionsFiles[] =
			{
				{ "shaders/es31/implicit_conversions.test",		"es31",		"GLSL ES 3.1 GL_EXT_shader_implicit_conversions Tests"	},
				{ "shaders/es32/implicit_conversions.test",		"es32",		"GLSL ES 3.2 GL_EXT_shader_implicit_conversions Tests"	},
			};
			addChild(new ShaderLibraryGroup(m_context, "implicit_conversions", "GL_EXT_shader_implicit_conversions Tests", DE_LENGTH_OF_ARRAY(s_implicitConversionsFiles), s_implicitConversionsFiles));
		}

		{
			static const ShaderLibraryGroup::File s_uniformBlockFiles[] =
			{
				{ "shaders/es31/uniform_block.test",	"es31",		"GLSL ES 3.1 Uniform block tests"	},
				{ "shaders/es32/uniform_block.test",	"es32",		"GLSL ES 3.2 Uniform block tests"	},
			};
			addChild(new ShaderLibraryGroup(m_context, "uniform_block", "Uniform block tests", DE_LENGTH_OF_ARRAY(s_uniformBlockFiles), s_uniformBlockFiles));
		}
	}